

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

vector<basisu::color_rgba> * __thiscall
basisu::vector<basisu::color_rgba>::operator=
          (vector<basisu::color_rgba> *this,vector<basisu::color_rgba> *other)

{
  vector<basisu::color_rgba> *in_RSI;
  vector<basisu::color_rgba> *in_RDI;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint32_t in_stack_ffffffffffffffdc;
  vector<basisu::color_rgba> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity < in_RSI->m_size) {
      clear(in_RDI);
      increase_capacity(in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                        (bool)in_stack_ffffffffffffffda);
    }
    else {
      resize(in_RDI,(size_t)in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
    }
    if ((in_RDI->m_p != (color_rgba *)0x0) && (in_RSI->m_p != (color_rgba *)0x0)) {
      memcpy(in_RDI->m_p,in_RSI->m_p,(ulong)in_RSI->m_size << 2);
    }
    in_RDI->m_size = in_RSI->m_size;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }